

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::rehash(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
         *this,size_t n)

{
  size_t sVar1;
  unsigned_long in_RSI;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_RDI;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *unaff_retaddr;
  size_t m;
  size_t in_stack_00000048;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_00000050;
  unsigned_long local_10 [2];
  
  if ((in_RSI != 0) || (in_RDI->capacity_ != 0)) {
    if ((in_RSI == 0) && (in_RDI->size_ == 0)) {
      destroy_slots(unaff_retaddr);
      HashtablezInfoHandle::RecordStorageChanged((HashtablezInfoHandle *)&in_RDI->field_0x20,0,0);
    }
    else {
      local_10[0] = in_RSI;
      sVar1 = size(in_RDI);
      std::max<unsigned_long>(local_10,(unsigned_long *)&stack0xffffffffffffffe0);
      sVar1 = NormalizeCapacity(sVar1);
      if ((local_10[0] == 0) || (in_RDI->capacity_ < sVar1)) {
        resize(in_stack_00000050,in_stack_00000048);
      }
    }
  }
  return;
}

Assistant:

void rehash(size_t n)
			{
				if (n == 0 && capacity_ == 0) return;
				if (n == 0 && size_ == 0) {
					destroy_slots();
					infoz_.RecordStorageChanged(0, 0);
					return;
				}
				// bitor is a faster way of doing `max` here. We will round up to the next
				// power-of-2-minus-1, so bitor is good enough.
				auto m = NormalizeCapacity((std::max)(n, size()));
				// n == 0 unconditionally rehashes as per the standard.
				if (n == 0 || m > capacity_) {
					resize(m);
				}
			}